

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::circle
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,float r,bool fill,color *c)

{
  ImU32 num_segments;
  byte in_SIL;
  ImDrawList *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 uVar1;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImColor *in_stack_ffffffffffffff90;
  ImDrawList *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float local_58 [5];
  ImVec2 local_44;
  float local_3c [5];
  ImVec2 local_28 [2];
  byte local_15;
  float local_14 [5];
  
  local_15 = in_SIL & 1;
  if (local_15 == 0) {
    uVar1._0_4_ = (in_RDI->CmdBuffer).Size;
    uVar1._4_4_ = (in_RDI->CmdBuffer).Capacity;
    local_14[0] = in_XMM2_Da;
    ImVec2::ImVec2(&local_44,in_XMM0_Da,in_XMM1_Da);
    ImColor::ImColor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,local_14[0],
                     (float)((ulong)uVar1 >> 0x20),(float)uVar1);
    num_segments = ImColor::operator_cast_to_unsigned_int((ImColor *)0x1976e8);
    local_58[0] = 250.0;
    std::min<float>(local_14,local_58);
    ImDrawList::AddCircle
              (in_RDI,(ImVec2 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (float)((ulong)in_stack_ffffffffffffff90 >> 0x20),(ImU32)in_stack_ffffffffffffff90,
               num_segments,local_14[0]);
  }
  else {
    this_00 = *(ImDrawList **)&in_RDI->CmdBuffer;
    ImVec2::ImVec2(local_28,in_XMM0_Da,in_XMM1_Da);
    ImColor::ImColor((ImColor *)this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                     (float)in_stack_ffffffffffffff80);
    ImColor::operator_cast_to_unsigned_int((ImColor *)0x19762e);
    local_3c[0] = 250.0;
    std::min<float>(local_14,local_3c);
    ImDrawList::AddCircleFilled
              (this_00,(ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),(ImU32)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::circle(float x, float y, float r, bool fill,
                                          const color::color& c) {
    if (fill) {
        draw_list->AddCircleFilled(ImVec2(x, y), r, ImColor(c.r, c.g, c.b, c.a),
                                   std::min(r, 250.f));
    } else {
        draw_list->AddCircle(ImVec2(x, y), r, ImColor(c.r, c.g, c.b, c.a),
                             std::min(r, 250.f));
    }
}